

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_get_length32(JSContext *ctx,uint32_t *pres,JSValue obj)

{
  int iVar1;
  JSValue val;
  
  val = JS_GetPropertyInternal(ctx,obj,0x30,obj,0);
  if ((int)val.tag == 6) {
    *pres = 0;
    return -1;
  }
  iVar1 = JS_ToInt32Free(ctx,(int32_t *)pres,val);
  return iVar1;
}

Assistant:

static __exception int js_get_length32(JSContext *ctx, uint32_t *pres,
                                       JSValueConst obj)
{
    JSValue len_val;
    len_val = JS_GetProperty(ctx, obj, JS_ATOM_length);
    if (JS_IsException(len_val)) {
        *pres = 0;
        return -1;
    }
    return JS_ToUint32Free(ctx, pres, len_val);
}